

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
          (DenseStorage<int,__1,__1,_1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_3)

{
  int *piVar1;
  DenseIndex param_3_local;
  DenseIndex nbRows_local;
  DenseIndex size_local;
  DenseStorage<int,__1,__1,_1,_0> *this_local;
  
  piVar1 = internal::conditional_aligned_new_auto<int,true>(size);
  this->m_data = piVar1;
  this->m_rows = nbRows;
  return;
}

Assistant:

DenseStorage(DenseIndex size, DenseIndex nbRows, DenseIndex) : m_data(internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size)), m_rows(nbRows)
    { EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN }